

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O3

db_bit * __thiscall lan::db::find_any(db *this,string *name,db_bit_type type,db_bit *ref)

{
  pointer pcVar1;
  int iVar2;
  db_bit *pdVar3;
  out_of_range *this_00;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  iVar2 = std::__cxx11::string::compare((char *)name);
  pdVar3 = this->anchor;
  if (pdVar3 == (db_bit *)0x0 || iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)name);
    if (iVar2 == 0) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,
                 "LANDB (empty_anchor_error): Using empty anchor, catch to continue.","");
      std::out_of_range::out_of_range(this_00,(string *)local_50);
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    while( true ) {
      pcVar1 = (name->_M_dataplus)._M_p;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar1,pcVar1 + name->_M_string_length);
      pdVar3 = find(this,&local_90,ref);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (pdVar3 == (db_bit *)0x0) break;
      if (pdVar3->type == type) {
        return pdVar3;
      }
      ref = pdVar3->nex;
    }
    pdVar3 = (db_bit *)0x0;
  }
  return pdVar3;
}

Assistant:

lan::db_bit * db::find_any(const std::string name, const lan::db_bit_type type, lan::db_bit * ref){
            lan::db_bit * buf = nullptr;
            if(name == "@" && anchor) return anchor;
            else if(name == "@") throw lan::errors::anchor_name_error(error_string(errors::_private::_empty_anchor_error, ""));
            while ((buf = find(name, ref))) {
                if(buf->type == type) return buf;
                ref = buf->nex;
            } return nullptr;
        }